

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O3

long * resolve_char(uchar c,bool do_aa,bool ignore_ambigs)

{
  long (*palVar1) [20];
  ulong uVar2;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,do_aa) == 0) {
    if (3 < c && ignore_ambigs) {
      return resolutions[0x11];
    }
    uVar2 = (ulong)c << 5;
    palVar1 = (long (*) [20])resolutions;
  }
  else {
    if (0x13 < c && ignore_ambigs) {
      return resolutions_AA[0x18];
    }
    uVar2 = (ulong)((uint)c * 0xa0);
    palVar1 = resolutions_AA;
  }
  return (long *)((long)*palVar1 + uVar2);
}

Assistant:

const long* resolve_char (unsigned char c, bool do_aa, bool ignore_ambigs) {
  
  if (do_aa) {
    if (ignore_ambigs && c >= 20) {
      return resolutions_AA[GAP_AA];
    }
    return resolutions_AA [c];
  } 
  
  if (ignore_ambigs && c >= 4) {
    return resolutions[GAP];
  }
  
  return resolutions [c];
  
}